

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_write_server_hello(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  size_t sVar3;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var4;
  char cVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  int iVar10;
  time_t tVar11;
  mbedtls_ssl_session *pmVar12;
  mbedtls_ssl_ciphersuite_t *pmVar13;
  mbedtls_cipher_info_t *pmVar14;
  mbedtls_ssl_handshake_params *pmVar15;
  size_t sVar16;
  int iVar17;
  uint uVar18;
  uchar *puVar19;
  uchar *puVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  size_t len;
  long lVar24;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar25;
  uchar *local_38;
  
  uVar25 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x845,"=> write server hello");
  uVar18 = *(uint *)&ssl->conf->field_0x164;
  if (((uVar18 & 2) == 0) || (ssl->handshake->verify_cookie_len == '\0')) {
    if (ssl->conf->f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x854,"no RNG provided");
      return -0x7400;
    }
    puVar1 = ssl->out_msg;
    mbedtls_ssl_write_version(ssl->major_ver,ssl->minor_ver,uVar18 >> 1 & 1,puVar1 + 4);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x867,"server hello, chosen version: [%d:%d]",(ulong)puVar1[4],
               CONCAT44(uVar25,(uint)puVar1[5]));
    tVar11 = time((time_t *)0x0);
    uVar18 = (uint)tVar11;
    *(uint *)(puVar1 + 6) =
         uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x870,"server hello, current time: %lu",tVar11);
    iVar10 = (*ssl->conf->f_rng)(ssl->conf->p_rng,puVar1 + 10,0x1c);
    if (iVar10 != 0) {
      return iVar10;
    }
    pmVar15 = ssl->handshake;
    uVar6 = *(undefined8 *)(puVar1 + 6);
    uVar7 = *(undefined8 *)(puVar1 + 0xe);
    uVar8 = *(undefined8 *)(puVar1 + 0x1e);
    *(undefined8 *)(pmVar15->randbytes + 0x30) = *(undefined8 *)(puVar1 + 0x16);
    *(undefined8 *)(pmVar15->randbytes + 0x38) = uVar8;
    *(undefined8 *)(pmVar15->randbytes + 0x20) = uVar6;
    *(undefined8 *)(pmVar15->randbytes + 0x28) = uVar7;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x87f,"server hello, random bytes",puVar1 + 6,0x20);
    if (ssl->handshake->resume != 0) goto LAB_00167aaa;
    if ((ssl->renego_status == 0) && (ssl->session_negotiate->id_len != 0)) {
      p_Var4 = ssl->conf->f_get_cache;
      if (p_Var4 == (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) goto LAB_00167bbc;
      iVar10 = (*p_Var4)(ssl->conf->p_cache,ssl->session_negotiate);
      if (iVar10 == 0) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x88e,"session successfully restored from cache");
        ssl->handshake->resume = 1;
      }
      else if (ssl->handshake->resume == 0) goto LAB_00167bbc;
LAB_00167aaa:
      len = ssl->session_negotiate->id_len;
      ssl->state = 0xc;
      iVar10 = mbedtls_ssl_derive_keys(ssl);
      if (iVar10 != 0) {
        pcVar21 = "mbedtls_ssl_derive_keys";
        iVar17 = 0x8b7;
        goto LAB_00167ba5;
      }
    }
    else {
LAB_00167bbc:
      ssl->state = ssl->state + 1;
      tVar11 = time((time_t *)0x0);
      pmVar12 = ssl->session_negotiate;
      pmVar12->start = tVar11;
      if (ssl->handshake->new_session_ticket == 0) {
        pmVar12->id_len = 0x20;
        len = 0x20;
        iVar10 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar12->id,0x20);
        if (iVar10 != 0) {
          return iVar10;
        }
      }
      else {
        pmVar12->id[8] = '\0';
        pmVar12->id[9] = '\0';
        pmVar12->id[10] = '\0';
        pmVar12->id[0xb] = '\0';
        pmVar12->id[0xc] = '\0';
        pmVar12->id[0xd] = '\0';
        pmVar12->id[0xe] = '\0';
        pmVar12->id[0xf] = '\0';
        pmVar12->id[0x10] = '\0';
        pmVar12->id[0x11] = '\0';
        pmVar12->id[0x12] = '\0';
        pmVar12->id[0x13] = '\0';
        pmVar12->id[0x14] = '\0';
        pmVar12->id[0x15] = '\0';
        pmVar12->id[0x16] = '\0';
        pmVar12->id[0x17] = '\0';
        pmVar12->id_len = 0;
        pmVar12->id[0] = '\0';
        pmVar12->id[1] = '\0';
        pmVar12->id[2] = '\0';
        pmVar12->id[3] = '\0';
        pmVar12->id[4] = '\0';
        pmVar12->id[5] = '\0';
        pmVar12->id[6] = '\0';
        pmVar12->id[7] = '\0';
        pmVar12->id[0x18] = '\0';
        pmVar12->id[0x19] = '\0';
        pmVar12->id[0x1a] = '\0';
        pmVar12->id[0x1b] = '\0';
        pmVar12->id[0x1c] = '\0';
        pmVar12->id[0x1d] = '\0';
        pmVar12->id[0x1e] = '\0';
        pmVar12->id[0x1f] = '\0';
        len = 0;
      }
    }
    puVar1[0x26] = (uchar)ssl->session_negotiate->id_len;
    memcpy(puVar1 + 0x27,ssl->session_negotiate->id,ssl->session_negotiate->id_len);
    sVar3 = ssl->session_negotiate->id_len;
    puVar19 = puVar1 + sVar3 + 0x27;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c8,"server hello, session id len.: %d",len);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8c9,"server hello, session id",puVar1 + 0x27,len);
    pcVar21 = "a";
    if (ssl->handshake->resume == 0) {
      pcVar21 = "no";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8cb,"%s session has been resumed",pcVar21);
    *puVar19 = *(uchar *)((long)&ssl->session_negotiate->ciphersuite + 1);
    puVar1[sVar3 + 0x28] = (uchar)ssl->session_negotiate->ciphersuite;
    puVar1[sVar3 + 0x29] = (uchar)ssl->session_negotiate->compression;
    pcVar21 = mbedtls_ssl_get_ciphersuite_name(ssl->session_negotiate->ciphersuite);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d2,"server hello, chosen ciphersuite: %s",pcVar21);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8d4,"server hello, compress alg.: 0x%02X",
               (ulong)(uint)ssl->session_negotiate->compression);
    puVar20 = puVar1 + sVar3 + 0x2c;
    if (ssl->secure_renegotiation == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x784,"server hello, secure renegotiation extension");
      (puVar1 + sVar3 + 0x2c)[0] = 0xff;
      (puVar1 + sVar3 + 0x2c)[1] = '\x01';
      iVar10 = ssl->renego_status;
      puVar1[sVar3 + 0x2e] = '\0';
      if (iVar10 == 0) {
        (puVar1 + sVar3 + 0x2f)[0] = '\x01';
        (puVar1 + sVar3 + 0x2f)[1] = '\0';
        puVar19 = puVar1 + sVar3 + 0x31;
      }
      else {
        puVar1[sVar3 + 0x2f] = (char)ssl->verify_data_len * '\x02' + '\x01';
        puVar1[sVar3 + 0x30] = (char)ssl->verify_data_len * '\x02';
        memcpy(puVar1 + sVar3 + 0x31,ssl->peer_verify_data,ssl->verify_data_len);
        sVar16 = ssl->verify_data_len;
        memcpy(puVar19 + sVar16 + 10,ssl->own_verify_data,sVar16);
        puVar19 = puVar19 + sVar16 + 10 + ssl->verify_data_len;
      }
      lVar22 = (long)puVar19 - (long)puVar20;
    }
    else {
      lVar22 = 0;
    }
    pmVar12 = ssl->session_negotiate;
    if (pmVar12->mfl_code == '\0') {
      lVar24 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ad,"server hello, max_fragment_length extension");
      puVar19 = puVar20 + lVar22;
      puVar19[0] = '\0';
      puVar19[1] = '\x01';
      puVar19[2] = '\0';
      puVar19[3] = '\x01';
      puVar1[lVar22 + sVar3 + 0x30] = ssl->session_negotiate->mfl_code;
      pmVar12 = ssl->session_negotiate;
      lVar24 = 5;
    }
    if (pmVar12->trunc_hmac == 0) {
      lVar23 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x70d,"server hello, adding truncated hmac extension");
      puVar19 = puVar20 + lVar24 + lVar22;
      puVar19[0] = '\0';
      puVar19[1] = '\x04';
      puVar19[2] = '\0';
      puVar19[3] = '\0';
      pmVar12 = ssl->session_negotiate;
      lVar23 = 4;
    }
    lVar23 = lVar23 + lVar24 + lVar22;
    if ((((pmVar12->encrypt_then_mac == 0) || (ssl->minor_ver == 0)) ||
        (pmVar13 = mbedtls_ssl_ciphersuite_from_id(pmVar12->ciphersuite),
        pmVar13 == (mbedtls_ssl_ciphersuite_t *)0x0)) ||
       ((pmVar14 = mbedtls_cipher_info_from_type(pmVar13->cipher),
        pmVar14 == (mbedtls_cipher_info_t *)0x0 || (pmVar14->mode != MBEDTLS_MODE_CBC)))) {
      lVar22 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x738,"server hello, adding encrypt then mac extension");
      puVar19 = puVar20 + lVar23;
      puVar19[0] = '\0';
      puVar19[1] = '\x16';
      puVar19[2] = '\0';
      puVar19[3] = '\0';
      lVar22 = 4;
    }
    lVar22 = lVar22 + lVar23;
    pmVar15 = ssl->handshake;
    if ((pmVar15->extended_ms == 0) || (ssl->minor_ver == 0)) {
      lVar24 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x753,"server hello, adding extended master secret extension");
      puVar19 = puVar20 + lVar22;
      puVar19[0] = '\0';
      puVar19[1] = '\x17';
      puVar19[2] = '\0';
      puVar19[3] = '\0';
      pmVar15 = ssl->handshake;
      lVar24 = 4;
    }
    lVar24 = lVar24 + lVar22;
    if (pmVar15->new_session_ticket == 0) {
      lVar22 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x76c,"server hello, adding session ticket extension");
      puVar19 = puVar20 + lVar24;
      puVar19[0] = '\0';
      puVar19[1] = '#';
      puVar19[2] = '\0';
      puVar19[3] = '\0';
      pmVar15 = ssl->handshake;
      lVar22 = 4;
    }
    lVar22 = lVar22 + lVar24;
    if ((pmVar15->cli_exts & 1) == 0) {
      lVar24 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7ca,"server hello, supported_point_formats extension");
      puVar19 = puVar20 + lVar22;
      puVar19[0] = '\0';
      puVar19[1] = '\v';
      puVar19[2] = '\0';
      puVar19[3] = '\x02';
      (puVar1 + lVar22 + sVar3 + 0x30)[0] = '\x01';
      (puVar1 + lVar22 + sVar3 + 0x30)[1] = '\0';
      lVar24 = 6;
    }
    lVar24 = lVar24 + lVar22;
    if (ssl->alpn_chosen == (char *)0x0) {
      lVar22 = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x7e3,"server hello, adding alpn extension");
      puVar19 = puVar20 + lVar24 + 7;
      puVar19[-7] = '\0';
      puVar19[-6] = '\x10';
      sVar16 = strlen(ssl->alpn_chosen);
      lVar22 = sVar16 + 7;
      puVar1[lVar24 + sVar3 + 0x2e] = (uchar)((uint)((int)sVar16 + 3) >> 8);
      cVar5 = (char)lVar22;
      puVar19[-4] = cVar5 + 0xfc;
      puVar1[lVar24 + sVar3 + 0x30] = (uchar)((uint)((int)sVar16 + 1) >> 8);
      puVar19[-2] = cVar5 + 0xfa;
      puVar19[-1] = cVar5 + 0xf9;
      memcpy(puVar19,ssl->alpn_chosen,sVar16);
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x8ff,"server hello, total extension length: %d",lVar22 + lVar24);
    lVar22 = lVar22 + lVar24;
    if (lVar22 == 0) {
      puVar20 = puVar1 + sVar3 + 0x2a;
    }
    else {
      *(ushort *)(puVar1 + sVar3 + 0x2a) = (ushort)lVar22 << 8 | (ushort)lVar22 >> 8;
      puVar20 = puVar20 + lVar22;
    }
    ssl->out_msglen = (long)puVar20 - (long)puVar1;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x02';
    iVar10 = mbedtls_ssl_write_record(ssl);
    pcVar21 = "<= write server hello";
    iVar17 = 0x90e;
LAB_001681a4:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar17,pcVar21);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84b,"client hello was not authenticated");
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84c,"<= write server hello");
    puVar1 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x804,"=> write hello verify request");
    mbedtls_ssl_write_version
              (ssl->major_ver,ssl->minor_ver,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar1 + 4);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x811,"server version",puVar1 + 4,2);
    p_Var2 = ssl->conf->f_cookie_write;
    if (p_Var2 == (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x817,"inconsistent cookie callbacks");
      return -0x6c00;
    }
    puVar19 = puVar1 + 7;
    local_38 = puVar19;
    iVar10 = (*p_Var2)(ssl->conf->p_cookie,&local_38,ssl->out_buf + 0x414d,ssl->cli_id,
                       ssl->cli_id_len);
    if (iVar10 == 0) {
      bVar9 = (char)local_38 - (char)puVar19;
      puVar1[6] = bVar9;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x828,"cookie sent",puVar19,(ulong)bVar9);
      ssl->out_msglen = (long)local_38 - (long)ssl->out_msg;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\x03';
      ssl->state = 0x12;
      iVar10 = mbedtls_ssl_write_record(ssl);
      if (iVar10 == 0) {
        pcVar21 = "<= write hello verify request";
        iVar10 = 0;
        iVar17 = 0x836;
        goto LAB_001681a4;
      }
      pcVar21 = "mbedtls_ssl_write_record";
      iVar17 = 0x832;
    }
    else {
      pcVar21 = "f_cookie_write";
      iVar17 = 0x822;
    }
LAB_00167ba5:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,iVar17,pcVar21,iVar10);
  }
  return iVar10;
}

Assistant:

static int ssl_write_server_hello( mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_HAVE_TIME)
    time_t t;
#endif
    int ret;
    size_t olen, ext_len = 0, n;
    unsigned char *buf, *p;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server hello" ) );

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->verify_cookie_len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "client hello was not authenticated" ) );
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

        return( ssl_write_hello_verify_request( ssl ) );
    }
#endif /* MBEDTLS_SSL_DTLS_HELLO_VERIFY */

    if( ssl->conf->f_rng == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "no RNG provided") );
        return( MBEDTLS_ERR_SSL_NO_RNG );
    }

    /*
     *     0  .   0   handshake type
     *     1  .   3   handshake length
     *     4  .   5   protocol version
     *     6  .   9   UNIX time()
     *    10  .  37   random bytes
     */
    buf = ssl->out_msg;
    p = buf + 4;

    mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                       ssl->conf->transport, p );
    p += 2;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen version: [%d:%d]",
                        buf[4], buf[5] ) );

#if defined(MBEDTLS_HAVE_TIME)
    t = time( NULL );
    *p++ = (unsigned char)( t >> 24 );
    *p++ = (unsigned char)( t >> 16 );
    *p++ = (unsigned char)( t >>  8 );
    *p++ = (unsigned char)( t       );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#else
    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 4 ) ) != 0 )
        return( ret );

    p += 4;
#endif /* MBEDTLS_HAVE_TIME */

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 28 ) ) != 0 )
        return( ret );

    p += 28;

    memcpy( ssl->handshake->randbytes + 32, buf + 6, 32 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, random bytes", buf + 6, 32 );

    /*
     * Resume is 0  by default, see ssl_handshake_init().
     * It may be already set to 1 by ssl_parse_session_ticket_ext().
     * If not, try looking up session ID in our cache.
     */
    if( ssl->handshake->resume == 0 &&
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status == MBEDTLS_SSL_INITIAL_HANDSHAKE &&
#endif
        ssl->session_negotiate->id_len != 0 &&
        ssl->conf->f_get_cache != NULL &&
        ssl->conf->f_get_cache( ssl->conf->p_cache, ssl->session_negotiate ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "session successfully restored from cache" ) );
        ssl->handshake->resume = 1;
    }

    if( ssl->handshake->resume == 0 )
    {
        /*
         * New session, create a new session id,
         * unless we're about to issue a session ticket
         */
        ssl->state++;

#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = time( NULL );
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        if( ssl->handshake->new_session_ticket != 0 )
        {
            ssl->session_negotiate->id_len = n = 0;
            memset( ssl->session_negotiate->id, 0, 32 );
        }
        else
#endif /* MBEDTLS_SSL_SESSION_TICKETS */
        {
            ssl->session_negotiate->id_len = n = 32;
            if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, ssl->session_negotiate->id,
                                    n ) ) != 0 )
                return( ret );
        }
    }
    else
    {
        /*
         * Resuming a session
         */
        n = ssl->session_negotiate->id_len;
        ssl->state = MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC;

        if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
            return( ret );
        }
    }

    /*
     *    38  .  38     session id length
     *    39  . 38+n    session id
     *   39+n . 40+n    chosen ciphersuite
     *   41+n . 41+n    chosen compression alg.
     *   42+n . 43+n    extensions length
     *   44+n . 43+n+m  extensions
     */
    *p++ = (unsigned char) ssl->session_negotiate->id_len;
    memcpy( p, ssl->session_negotiate->id, ssl->session_negotiate->id_len );
    p += ssl->session_negotiate->id_len;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 39, n );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "%s session has been resumed",
                   ssl->handshake->resume ? "a" : "no" ) );

    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite >> 8 );
    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite      );
    *p++ = (unsigned char)( ssl->session_negotiate->compression      );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen ciphersuite: %s",
           mbedtls_ssl_get_ciphersuite_name( ssl->session_negotiate->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, compress alg.: 0x%02X",
                   ssl->session_negotiate->compression ) );

    /*
     *  First write extensions, then the total length
     */
    ssl_write_renegotiation_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    ssl_write_max_fragment_length_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
    ssl_write_truncated_hmac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    ssl_write_encrypt_then_mac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    ssl_write_extended_ms_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    ssl_write_session_ticket_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    ssl_write_supported_point_formats_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ALPN)
    ssl_write_alpn_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, total extension length: %d", ext_len ) );

    if( ext_len > 0 )
    {
        *p++ = (unsigned char)( ( ext_len >> 8 ) & 0xFF );
        *p++ = (unsigned char)( ( ext_len      ) & 0xFF );
        p += ext_len;
    }

    ssl->out_msglen  = p - buf;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_HELLO;

    ret = mbedtls_ssl_write_record( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

    return( ret );
}